

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O3

int vx__triangle_box_overlap(vx_vertex_t boxcenter,vx_vertex_t halfboxsize,vx_triangle_t triangle)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_f8;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_10;
  
  local_c8.v[2] = (float)halfboxsize.field_0._8_4_;
  fVar3 = halfboxsize.field_0._4_4_;
  local_78 = boxcenter.field_0._8_4_;
  fStack_ac = boxcenter.field_0._0_4_;
  fStack_9c = boxcenter.field_0._4_4_;
  fVar7 = triangle.p1.field_0.v[1] - fStack_9c;
  fVar9 = triangle.p3.field_0.v[2] - local_78;
  fVar6 = triangle.p1.field_0.v[2] - local_78;
  local_78 = triangle.p2.field_0.v[2] - local_78;
  fVar14 = triangle.p3.field_0.v[1] - fStack_9c;
  fStack_a4 = triangle.p2.field_0.v[1] - fStack_9c;
  fStack_a0 = 0.0 - fStack_9c;
  fStack_9c = 0.0 - fStack_9c;
  fVar13 = fStack_a4 - fVar7;
  fVar15 = local_78 - fVar6;
  fVar16 = fVar15 * fVar7 - fVar6 * fVar13;
  fVar10 = fVar15 * fVar14 - fVar9 * fVar13;
  fVar4 = ABS(fVar15) * fVar3 + ABS(fVar13) * local_c8.v[2];
  fVar5 = fVar16;
  if (fVar10 <= fVar16) {
    fVar5 = fVar10;
  }
  iVar1 = 0;
  local_c8._0_8_ = halfboxsize.field_0._0_8_;
  iVar2 = 0;
  if (fVar5 <= fVar4) {
    if (fVar10 <= fVar16) {
      fVar10 = fVar16;
    }
    iVar2 = iVar1;
    if (-fVar4 <= fVar10) {
      local_28 = triangle.p1.field_0.v[0] - fStack_ac;
      fVar4 = triangle.p3.field_0.v[0] - fStack_ac;
      fStack_b4 = triangle.p2.field_0.v[0] - fStack_ac;
      fStack_b0 = 0.0 - fStack_ac;
      fStack_ac = 0.0 - fStack_ac;
      local_68 = fStack_b4 - local_28;
      fVar16 = fVar6 * local_68 - fVar15 * local_28;
      fVar10 = local_68 * fVar9 - fVar15 * fVar4;
      fVar5 = fVar16;
      if (fVar10 <= fVar16) {
        fVar5 = fVar10;
      }
      local_f8 = halfboxsize.field_0._0_4_;
      fVar8 = ABS(fVar15) * local_f8 + ABS(local_68) * local_c8.v[2];
      if (fVar5 <= fVar8) {
        if (fVar10 <= fVar16) {
          fVar10 = fVar16;
        }
        if (-fVar8 <= fVar10) {
          fVar16 = fVar13 * fVar4 - local_68 * fVar14;
          fVar10 = fVar13 * fStack_b4 - local_68 * fStack_a4;
          fVar5 = fVar16;
          if (fVar10 <= fVar16) {
            fVar5 = fVar10;
          }
          fVar8 = ABS(fVar13) * local_f8 + ABS(local_68) * fVar3;
          if (fVar5 <= fVar8) {
            if (fVar10 <= fVar16) {
              fVar10 = fVar16;
            }
            if (-fVar8 <= fVar10) {
              local_a8 = fVar14 - fStack_a4;
              fVar8 = fVar9 - local_78;
              fVar16 = fVar8 * fVar7 - fVar6 * local_a8;
              local_98 = ZEXT416((uint)fVar8);
              fVar10 = fVar8 * fVar14 - fVar9 * local_a8;
              fVar11 = ABS(fVar8) * fVar3 + ABS(local_a8) * local_c8.v[2];
              fVar5 = fVar16;
              if (fVar10 <= fVar16) {
                fVar5 = fVar10;
              }
              if (fVar5 <= fVar11) {
                if (fVar10 <= fVar16) {
                  fVar10 = fVar16;
                }
                if (-fVar11 <= fVar10) {
                  local_b8 = fVar4 - fStack_b4;
                  fVar16 = fVar6 * local_b8 - fVar8 * local_28;
                  fVar10 = local_b8 * fVar9 - fVar8 * fVar4;
                  fVar5 = fVar16;
                  if (fVar10 <= fVar16) {
                    fVar5 = fVar10;
                  }
                  fVar11 = ABS(fVar8) * local_f8 + ABS(local_b8) * local_c8.v[2];
                  if (fVar5 <= fVar11) {
                    if (fVar10 <= fVar16) {
                      fVar10 = fVar16;
                    }
                    if (-fVar11 <= fVar10) {
                      fVar16 = local_a8 * local_28 - local_b8 * fVar7;
                      fVar10 = local_a8 * fStack_b4 - local_b8 * fStack_a4;
                      fVar5 = fVar16;
                      if (fVar10 <= fVar16) {
                        fVar5 = fVar10;
                      }
                      fVar11 = ABS(local_a8) * local_f8 + ABS(local_b8) * fVar3;
                      if (fVar5 <= fVar11) {
                        if (fVar10 <= fVar16) {
                          fVar10 = fVar16;
                        }
                        if (-fVar11 <= fVar10) {
                          local_48 = fVar7 - fVar14;
                          fVar16 = fVar6 - fVar9;
                          local_38 = ABS(local_48);
                          uStack_30 = 0;
                          uStack_2c = 0;
                          fVar11 = fVar7 * fVar16 - fVar6 * local_48;
                          fVar10 = fStack_a4 * fVar16 - local_78 * local_48;
                          fVar5 = fVar11;
                          if (fVar10 <= fVar11) {
                            fVar5 = fVar10;
                          }
                          uStack_34 = 0;
                          fVar12 = ABS(fVar16) * fVar3 + local_38 * local_c8.v[2];
                          if (fVar5 <= fVar12) {
                            if (fVar10 <= fVar11) {
                              fVar10 = fVar11;
                            }
                            if (-fVar12 <= fVar10) {
                              fVar12 = local_28 - fVar4;
                              fVar11 = fVar6 * fVar12 - fVar16 * local_28;
                              fVar5 = local_78 * fVar12 - fVar16 * fStack_b4;
                              fVar10 = fVar11;
                              if (fVar5 <= fVar11) {
                                fVar10 = fVar5;
                              }
                              fVar16 = ABS(fVar16) * local_f8 + ABS(fVar12) * local_c8.v[2];
                              if (fVar10 <= fVar16) {
                                if (fVar5 <= fVar11) {
                                  fVar5 = fVar11;
                                }
                                if (-fVar16 <= fVar5) {
                                  fVar16 = local_48 * fVar4 - fVar14 * fVar12;
                                  fVar5 = local_48 * fStack_b4 - fStack_a4 * fVar12;
                                  fVar10 = fVar16;
                                  if (fVar5 <= fVar16) {
                                    fVar10 = fVar5;
                                  }
                                  fVar11 = local_38 * local_f8 + ABS(fVar12) * fVar3;
                                  if (fVar10 <= fVar11) {
                                    if (fVar5 <= fVar16) {
                                      fVar5 = fVar16;
                                    }
                                    if (-fVar11 <= fVar5) {
                                      fVar5 = fStack_b4;
                                      if (local_28 <= fStack_b4) {
                                        fVar5 = local_28;
                                      }
                                      fVar10 = fVar4;
                                      if (fVar5 <= fVar4) {
                                        fVar10 = fVar5;
                                      }
                                      if (fVar10 <= local_f8) {
                                        fVar5 = fStack_b4;
                                        if (fStack_b4 <= local_28) {
                                          fVar5 = local_28;
                                        }
                                        if (fVar4 <= fVar5) {
                                          fVar4 = fVar5;
                                        }
                                        if (-local_f8 <= fVar4) {
                                          fVar5 = fStack_a4;
                                          if (fVar7 <= fStack_a4) {
                                            fVar5 = fVar7;
                                          }
                                          fVar10 = fVar14;
                                          if (fVar5 <= fVar14) {
                                            fVar10 = fVar5;
                                          }
                                          if (fVar10 <= fVar3) {
                                            fVar5 = fStack_a4;
                                            if (fStack_a4 <= fVar7) {
                                              fVar5 = fVar7;
                                            }
                                            if (fVar14 <= fVar5) {
                                              fVar14 = fVar5;
                                            }
                                            if (-fVar3 <= fVar14) {
                                              fVar5 = local_78;
                                              if (fVar6 <= local_78) {
                                                fVar5 = fVar6;
                                              }
                                              fVar10 = fVar9;
                                              if (fVar5 <= fVar9) {
                                                fVar10 = fVar5;
                                              }
                                              if (fVar10 <= local_c8.v[2]) {
                                                fVar5 = local_78;
                                                if (local_78 <= fVar6) {
                                                  fVar5 = fVar6;
                                                }
                                                if (fVar9 <= fVar5) {
                                                  fVar9 = fVar5;
                                                }
                                                if (-local_c8.v[2] <= fVar9) {
                                                  fVar5 = fVar13 * fVar8 + -fVar15 * local_a8;
                                                  fVar10 = fVar15 * local_b8 + -local_68 * fVar8;
                                                  local_10.v[2] =
                                                       local_68 * local_a8 + -fVar13 * local_b8;
                                                  local_10._0_8_ = CONCAT44(fVar10,fVar5);
                                                  local_88 = fStack_b4;
                                                  fStack_84 = fStack_b4;
                                                  fStack_80 = fStack_b4;
                                                  fStack_7c = fStack_b4;
                                                  fStack_74 = local_78;
                                                  fStack_70 = local_78;
                                                  fStack_6c = local_78;
                                                  fStack_64 = fStack_b4;
                                                  fStack_60 = fStack_b4;
                                                  fStack_5c = fStack_b4;
                                                  local_58 = fStack_a4;
                                                  fStack_54 = fStack_a4;
                                                  fStack_50 = fStack_a4;
                                                  fStack_4c = fStack_a4;
                                                  fStack_44 = local_48;
                                                  fStack_40 = local_48;
                                                  fStack_3c = local_48;
                                                  fStack_24 = fStack_b4;
                                                  fStack_20 = fStack_b0;
                                                  fStack_1c = fStack_ac;
                                                  iVar2 = vx__plane_box_overlap
                                                                    ((vx_vertex_t *)
                                                                     &local_10.field_1,
                                                                     -(local_10.v[2] * fVar6 +
                                                                      fVar5 * local_28 +
                                                                      fVar7 * fVar10),
                                                                     (vx_vertex_t *)
                                                                     &local_c8.field_1);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int vx__triangle_box_overlap(vx_vertex_t boxcenter,
    vx_vertex_t halfboxsize,
    vx_triangle_t triangle)
{
    vx_vertex_t v1, v2, v3, normal, e1, e2, e3;
    float min, max, d, p1, p2, p3, rad, fex, fey, fez;

    v1 = triangle.p1;
    v2 = triangle.p2;
    v3 = triangle.p3;

    vx__vertex_sub(&v1, &boxcenter);
    vx__vertex_sub(&v2, &boxcenter);
    vx__vertex_sub(&v3, &boxcenter);

    e1 = v2;
    e2 = v3;
    e3 = v1;

    vx__vertex_sub(&e1, &v1);
    vx__vertex_sub(&e2, &v2);
    vx__vertex_sub(&e3, &v3);

    fex = fabs(e1.x);
    fey = fabs(e1.y);
    fez = fabs(e1.z);

    AXISTEST_X01(e1.z, e1.y, fez, fey);
    AXISTEST_Y02(e1.z, e1.x, fez, fex);
    AXISTEST_Z12(e1.y, e1.x, fey, fex);

    fex = fabs(e2.x);
    fey = fabs(e2.y);
    fez = fabs(e2.z);

    AXISTEST_X01(e2.z, e2.y, fez, fey);
    AXISTEST_Y02(e2.z, e2.x, fez, fex);
    AXISTEST_Z0(e2.y, e2.x, fey, fex);

    fex = fabs(e3.x);
    fey = fabs(e3.y);
    fez = fabs(e3.z);

    AXISTEST_X2(e3.z, e3.y, fez, fey);
    AXISTEST_Y1(e3.z, e3.x, fez, fex);
    AXISTEST_Z12(e3.y, e3.x, fey, fex);

    VX_FINDMINMAX(v1.x, v2.x, v3.x, min, max);
    if (min > halfboxsize.x || max < -halfboxsize.x) {
        return false;
    }

    VX_FINDMINMAX(v1.y, v2.y, v3.y, min, max);
    if (min > halfboxsize.y || max < -halfboxsize.y) {
        return false;
    }

    VX_FINDMINMAX(v1.z, v2.z, v3.z, min, max);
    if (min > halfboxsize.z || max < -halfboxsize.z) {
        return false;
    }

    normal = vx__vertex_cross(&e1, &e2);
    d = -vx__vertex_dot(&normal, &v1);

    if (!vx__plane_box_overlap(&normal, d, &halfboxsize)) {
        return false;
    }

    return true;
}